

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_info.hpp
# Opt level: O2

uint16_t * __thiscall duckdb::DeleteInfo::GetRows(DeleteInfo *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->is_consecutive != true) {
    return this->rows;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"DeleteInfo is consecutive - rows are not accessible",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const uint16_t *GetRows() const {
		if (is_consecutive) {
			throw InternalException("DeleteInfo is consecutive - rows are not accessible");
		}
		return rows;
	}